

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeBase * __thiscall
ExpressionContext::GetBinaryOpResultType(ExpressionContext *this,TypeBase *a,TypeBase *b)

{
  TypeBase *b_local;
  TypeBase *a_local;
  ExpressionContext *this_local;
  
  if ((a == this->typeDouble) || (b == this->typeDouble)) {
    this_local = (ExpressionContext *)this->typeDouble;
  }
  else if ((a == this->typeFloat) || (b == this->typeFloat)) {
    this_local = (ExpressionContext *)this->typeFloat;
  }
  else if ((a == this->typeLong) || (b == this->typeLong)) {
    this_local = (ExpressionContext *)this->typeLong;
  }
  else if ((a == this->typeInt) || (b == this->typeInt)) {
    this_local = (ExpressionContext *)this->typeInt;
  }
  else if ((a == this->typeShort) || (b == this->typeShort)) {
    this_local = (ExpressionContext *)this->typeShort;
  }
  else if ((a == this->typeChar) || (b == this->typeChar)) {
    this_local = (ExpressionContext *)this->typeChar;
  }
  else if ((a == this->typeBool) || (b == this->typeBool)) {
    this_local = (ExpressionContext *)this->typeBool;
  }
  else {
    this_local = (ExpressionContext *)0x0;
  }
  return (TypeBase *)this_local;
}

Assistant:

TypeBase* ExpressionContext::GetBinaryOpResultType(TypeBase* a, TypeBase* b)
{
	if(a == typeDouble || b == typeDouble)
		return typeDouble;

	if(a == typeFloat || b == typeFloat)
		return typeFloat;

	if(a == typeLong || b == typeLong)
		return typeLong;

	if(a == typeInt || b == typeInt)
		return typeInt;

	if(a == typeShort || b == typeShort)
		return typeShort;

	if(a == typeChar || b == typeChar)
		return typeChar;

	if(a == typeBool || b == typeBool)
		return typeBool;

	return NULL;
}